

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR xpath_substring_after
                 (lyxp_set **args,uint32_t UNUSED_arg_count,lyxp_set *set,uint32_t options)

{
  ly_ctx *plVar1;
  ly_bool lVar2;
  lysc_node *plVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  LY_ERR ret___1;
  LY_ERR ret__;
  LY_ERR rc;
  lysc_node_leaf *sleaf;
  char *ptr;
  uint32_t options_local;
  lyxp_set *set_local;
  uint32_t UNUSED_arg_count_local;
  lyxp_set **args_local;
  
  if ((options & 0x1c) == 0) {
    args_local._4_4_ = lyxp_set_cast(*args,LYXP_SET_STRING);
    if ((args_local._4_4_ == LY_SUCCESS) &&
       (args_local._4_4_ = lyxp_set_cast(args[1],LYXP_SET_STRING), args_local._4_4_ == LY_SUCCESS))
    {
      pcVar4 = strstr(((*args)->val).str,(args[1]->val).str);
      if (pcVar4 == (char *)0x0) {
        set_fill_string(set,"",0);
      }
      else {
        sVar5 = strlen((args[1]->val).str);
        sVar6 = strlen((args[1]->val).str);
        sVar6 = strlen(pcVar4 + sVar6);
        set_fill_string(set,pcVar4 + sVar5,(uint32_t)sVar6);
      }
      args_local._4_4_ = LY_SUCCESS;
    }
  }
  else {
    if (((*args)->type == LYXP_SET_SCNODE_SET) &&
       (plVar3 = warn_get_scnode_in_ctx(*args), plVar3 != (lysc_node *)0x0)) {
      if ((plVar3->nodetype & 0xc) == 0) {
        plVar1 = set->ctx;
        pcVar4 = lys_nodetype2str(plVar3->nodetype);
        ly_log(plVar1,LY_LLWRN,LY_SUCCESS,"Argument #1 of %s is a %s node \"%s\".",
               "xpath_substring_after",pcVar4,plVar3->name);
      }
      else {
        lVar2 = warn_is_string_type((lysc_type *)plVar3[1].parent);
        if (lVar2 == '\0') {
          ly_log(set->ctx,LY_LLWRN,LY_SUCCESS,
                 "Argument #1 of %s is node \"%s\", not of string-type.","xpath_substring_after",
                 plVar3->name);
        }
      }
    }
    if ((args[1]->type == LYXP_SET_SCNODE_SET) &&
       (plVar3 = warn_get_scnode_in_ctx(args[1]), plVar3 != (lysc_node *)0x0)) {
      if ((plVar3->nodetype & 0xc) == 0) {
        plVar1 = set->ctx;
        pcVar4 = lys_nodetype2str(plVar3->nodetype);
        ly_log(plVar1,LY_LLWRN,LY_SUCCESS,"Argument #2 of %s is a %s node \"%s\".",
               "xpath_substring_after",pcVar4,plVar3->name);
      }
      else {
        lVar2 = warn_is_string_type((lysc_type *)plVar3[1].parent);
        if (lVar2 == '\0') {
          ly_log(set->ctx,LY_LLWRN,LY_SUCCESS,
                 "Argument #2 of %s is node \"%s\", not of string-type.","xpath_substring_after",
                 plVar3->name);
        }
      }
    }
    set_scnode_clear_ctx(set,1);
    args_local._4_4_ = LY_SUCCESS;
  }
  return args_local._4_4_;
}

Assistant:

static LY_ERR
xpath_substring_after(struct lyxp_set **args, uint32_t UNUSED(arg_count), struct lyxp_set *set, uint32_t options)
{
    char *ptr;
    struct lysc_node_leaf *sleaf;
    LY_ERR rc = LY_SUCCESS;

    if (options & LYXP_SCNODE_ALL) {
        if ((args[0]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }

        if ((args[1]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[1]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #2 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #2 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_VAL);
        return rc;
    }

    rc = lyxp_set_cast(args[0], LYXP_SET_STRING);
    LY_CHECK_RET(rc);
    rc = lyxp_set_cast(args[1], LYXP_SET_STRING);
    LY_CHECK_RET(rc);

    ptr = strstr(args[0]->val.str, args[1]->val.str);
    if (ptr) {
        set_fill_string(set, ptr + strlen(args[1]->val.str), strlen(ptr + strlen(args[1]->val.str)));
    } else {
        set_fill_string(set, "", 0);
    }

    return LY_SUCCESS;
}